

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data.cpp
# Opt level: O1

void __thiscall
duckdb::ColumnData::AppendData
          (ColumnData *this,BaseStatistics *append_stats,ColumnAppendState *state,
          UnifiedVectorFormat *vdata,idx_t append_count)

{
  idx_t iVar1;
  reference pvVar2;
  idx_t offset;
  _Head_base<0UL,_duckdb::ColumnSegment_*,_false> this_00;
  idx_t iVar3;
  bool bVar4;
  SegmentLock l;
  unique_lock<std::mutex> local_60;
  vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_true> *local_50;
  mutex *local_48;
  BaseStatistics *local_40;
  UnifiedVectorFormat *local_38;
  
  LOCK();
  (this->count).super___atomic_base<unsigned_long>._M_i =
       (this->count).super___atomic_base<unsigned_long>._M_i + append_count;
  UNLOCK();
  local_48 = &(this->data).super_SegmentTree<duckdb::ColumnSegment,_false>.node_lock;
  local_50 = &(this->data).super_SegmentTree<duckdb::ColumnSegment,_false>.nodes;
  offset = 0;
  local_40 = append_stats;
  local_38 = vdata;
  do {
    iVar1 = ColumnSegment::Append(state->current,state,local_38,offset,append_count);
    BaseStatistics::Merge(local_40,&(state->current->stats).statistics);
    iVar3 = append_count;
    if (append_count - iVar1 != 0) {
      local_60._M_device = local_48;
      local_60._M_owns = false;
      ::std::unique_lock<std::mutex>::lock(&local_60);
      local_60._M_owns = true;
      AppendTransientSegment
                (this,(SegmentLock *)&local_60,
                 (state->current->super_SegmentBase<duckdb::ColumnSegment>).count.
                 super___atomic_base<unsigned_long>._M_i +
                 (state->current->super_SegmentBase<duckdb::ColumnSegment>).start);
      if ((this->data).super_SegmentTree<duckdb::ColumnSegment,_false>.nodes.
          super_vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
          .
          super__Vector_base<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          *(pointer *)
           ((long)&(this->data).super_SegmentTree<duckdb::ColumnSegment,_false>.nodes.
                   super_vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
                   .
                   super__Vector_base<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
                   ._M_impl.super__Vector_impl_data + 8)) {
        this_00._M_head_impl = (ColumnSegment *)0x0;
      }
      else {
        pvVar2 = vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_true>::back(local_50);
        this_00._M_head_impl =
             (pvVar2->node).
             super_unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>.
             _M_t.
             super___uniq_ptr_impl<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::ColumnSegment_*,_std::default_delete<duckdb::ColumnSegment>_>
             .super__Head_base<0UL,_duckdb::ColumnSegment_*,_false>._M_head_impl;
      }
      state->current = this_00._M_head_impl;
      ColumnSegment::InitializeAppend(this_00._M_head_impl,state);
      ::std::unique_lock<std::mutex>::~unique_lock(&local_60);
      offset = offset + iVar1;
      iVar3 = append_count - iVar1;
    }
    bVar4 = append_count != iVar1;
    append_count = iVar3;
  } while (bVar4);
  return;
}

Assistant:

void ColumnData::AppendData(BaseStatistics &append_stats, ColumnAppendState &state, UnifiedVectorFormat &vdata,
                            idx_t append_count) {
	idx_t offset = 0;
	this->count += append_count;
	while (true) {
		// append the data from the vector
		idx_t copied_elements = state.current->Append(state, vdata, offset, append_count);
		append_stats.Merge(state.current->stats.statistics);
		if (copied_elements == append_count) {
			// finished copying everything
			break;
		}

		// we couldn't fit everything we wanted in the current column segment, create a new one
		{
			auto l = data.Lock();
			AppendTransientSegment(l, state.current->start + state.current->count);
			state.current = data.GetLastSegment(l);
			state.current->InitializeAppend(state);
		}
		offset += copied_elements;
		append_count -= copied_elements;
	}
}